

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_finishget(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  Table *events;
  TValue *f;
  TValue *io1;
  int iVar1;
  
  iVar1 = 2000;
  do {
    if (slot == (TValue *)0x0) {
      f = luaT_gettmbyobj(L,t,TM_INDEX);
      if ((f->tt_ & 0xf) == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      events = *(Table **)((t->value_).f + 0x28);
      if ((events == (Table *)0x0) || ((events->flags & 1) != 0)) {
        f = (TValue *)0x0;
      }
      else {
        f = luaT_gettm(events,TM_INDEX,L->l_G->tmname[0]);
      }
      if (f == (TValue *)0x0) {
        (val->val).tt_ = '\0';
        return;
      }
    }
    if ((f->tt_ & 0xf) == 6) {
      luaT_callTMres(L,f,t,key,val);
      return;
    }
    if (f->tt_ == 0x45) {
      slot = luaH_get((Table *)(f->value_).gc,key);
      if ((slot->tt_ & 0xf) != 0) {
        (val->val).value_ = slot->value_;
        (val->val).tt_ = slot->tt_;
        return;
      }
    }
    else {
      slot = (TValue *)0x0;
    }
    iVar1 = iVar1 + -1;
    t = f;
  } while (iVar1 != 0);
  luaG_runerror(L,"\'__index\' chain too long; possible loop");
}

Assistant:

void luaV_finishget (lua_State *L, const TValue *t, TValue *key, StkId val,
                      const TValue *slot) {
  int loop;  /* counter to avoid infinite loops */
  const TValue *tm;  /* metamethod */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    if (slot == NULL) {  /* 't' is not a table? */
      lua_assert(!ttistable(t));
      tm = luaT_gettmbyobj(L, t, TM_INDEX);
      if (l_unlikely(notm(tm)))
        luaG_typeerror(L, t, "index");  /* no metamethod */
      /* else will try the metamethod */
    }
    else {  /* 't' is a table */
      lua_assert(isempty(slot));
      tm = fasttm(L, hvalue(t)->metatable, TM_INDEX);  /* table's metamethod */
      if (tm == NULL) {  /* no metamethod? */
        setnilvalue(s2v(val));  /* result is nil */
        return;
      }
      /* else will try the metamethod */
    }
    if (ttisfunction(tm)) {  /* is metamethod a function? */
      luaT_callTMres(L, tm, t, key, val);  /* call it */
      return;
    }
    t = tm;  /* else try to access 'tm[key]' */
    if (luaV_fastget(L, t, key, slot, luaH_get)) {  /* fast track? */
      setobj2s(L, val, slot);  /* done */
      return;
    }
    /* else repeat (tail call 'luaV_finishget') */
  }
  luaG_runerror(L, "'__index' chain too long; possible loop");
}